

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SamplerArrayIndexing.cpp
# Opt level: O2

char * __thiscall
glcts::GPUShader5SamplerArrayIndexing::getFragmentShaderCode(GPUShader5SamplerArrayIndexing *this)

{
  return 
  "${VERSION}\n\n${GPU_SHADER5_REQUIRE}\n\nprecision highp float;\n\nuniform sampler2D samplers[4];\n\nlayout(location = 0) out vec4 outColor;\n\nvoid main(void)\n{\n    outColor = vec4(0, 0, 0, 0);\n\n    for (int i = 0;i < 4; ++i)\n    {\n        outColor +=  texture(samplers[i],vec2(0,0));\n    }\n}\n"
  ;
}

Assistant:

const char* GPUShader5SamplerArrayIndexing::getFragmentShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${GPU_SHADER5_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"uniform sampler2D samplers[4];\n"
								"\n"
								"layout(location = 0) out vec4 outColor;\n"
								"\n"
								"void main(void)\n"
								"{\n"
								"    outColor = vec4(0, 0, 0, 0);\n"
								"\n"
								"    for (int i = 0;i < 4; ++i)\n"
								"    {\n"
								"        outColor +=  texture(samplers[i],vec2(0,0));\n"
								"    }\n"
								"}\n";

	return result;
}